

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O3

void get_order_then_remap
               (int size,vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *_edges,
               vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges)

{
  pointer *pppVar1;
  pointer ppVar2;
  iterator __position;
  undefined1 auVar3 [16];
  pair<int,_int> *e;
  pointer ppVar4;
  ulong uVar5;
  pair<int,_int> *ppVar6;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  pair<int,_int> *e_1;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  pair<int,_int> local_38;
  long lVar9;
  
  ppVar2 = (_edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  auVar3 = _DAT_001211f0;
  auVar8 = _DAT_001211e0;
  for (ppVar4 = (_edges->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start; _DAT_001211e0 = auVar8,
      _DAT_001211f0 = auVar3, ppVar4 != ppVar2; ppVar4 = ppVar4 + 1) {
    order[ppVar4->first].second = order[ppVar4->first].second + 1;
    order[ppVar4->second].second = order[ppVar4->second].second + 1;
    auVar3 = _DAT_001211f0;
    auVar8 = _DAT_001211e0;
  }
  if (0 < size) {
    lVar9 = (ulong)(uint)size - 1;
    auVar7._8_4_ = (int)lVar9;
    auVar7._0_8_ = lVar9;
    auVar7._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar5 = 0;
    auVar7 = auVar7 ^ auVar3;
    do {
      auVar10 = auVar8 ^ auVar3;
      if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                  auVar7._4_4_ < auVar10._4_4_) & 1)) {
        order[uVar5].first = (int)uVar5;
      }
      if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
          auVar10._12_4_ <= auVar7._12_4_) {
        order[uVar5 + 1].first = (int)uVar5 + 1;
      }
      uVar5 = uVar5 + 2;
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
    } while ((size + 1U & 0xfffffffe) != uVar5);
  }
  if (size != 0) {
    uVar5 = (ulong)size;
    ppVar6 = order;
    lVar9 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<std::pair<int,int>*,long,__gnu_cxx::__ops::_Iter_comp_iter<int(*)(std::pair<int,int>const&,std::pair<int,int>const&)>>
              (order,order + uVar5,(ulong)(((uint)lVar9 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<int_(*)(const_std::pair<int,_int>_&,_const_std::pair<int,_int>_&)>)
               0x11531b);
    std::
    __final_insertion_sort<std::pair<int,int>*,__gnu_cxx::__ops::_Iter_comp_iter<int(*)(std::pair<int,int>const&,std::pair<int,int>const&)>>
              (order,order + uVar5,
               (_Iter_comp_iter<int_(*)(const_std::pair<int,_int>_&,_const_std::pair<int,_int>_&)>)
               0x11531b);
    if (0 < size) {
      uVar5 = 0;
      do {
        ord_map[ppVar6->first] = (int)uVar5;
        uVar5 = uVar5 + 1;
        ppVar6 = ppVar6 + 1;
      } while ((uint)size != uVar5);
    }
  }
  ppVar2 = (_edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (_edges->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar2; ppVar4 = ppVar4 + 1) {
    local_38.second = ord_map[ppVar4->second];
    local_38.first = ord_map[ppVar4->first];
    __position._M_current =
         (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      _M_realloc_insert<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,__position,
                 &local_38);
    }
    else {
      *__position._M_current = local_38;
      pppVar1 = &(edges->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
  }
  return;
}

Assistant:

void get_order_then_remap(int size, const vector<pair<int, int> > &_edges, vector<pair<int, int> > &edges) {
    /* get the order by degree */
    for (auto &e: _edges) {
        ++order[e.first].second;
        ++order[e.second].second;
    }
    for (int i = 0; i < size; ++i) order[i].first = i;
    sort(order, order + size, cmp_order);

    /* remap vertex */
    for (int i = 0; i < size; ++i) ord_map[order[i].first] = i;
    for (auto &e: _edges) {
        edges.push_back(make_pair(ord_map[e.first], ord_map[e.second]));
    }
}